

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O0

void __thiscall
TypeStruct::setFields(TypeStruct *this,vector<TypeField,_std::allocator<TypeField>_> *fd)

{
  int iVar1;
  bool bVar2;
  int4 iVar3;
  reference pTVar4;
  __normal_iterator<const_TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_> local_38
  ;
  TypeField *local_30;
  int local_24;
  const_iterator cStack_20;
  int4 end;
  const_iterator iter;
  vector<TypeField,_std::allocator<TypeField>_> *fd_local;
  TypeStruct *this_local;
  
  iter._M_current = (TypeField *)fd;
  __gnu_cxx::
  __normal_iterator<const_TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_>::
  __normal_iterator(&stack0xffffffffffffffe0);
  (this->super_Datatype).size = 0;
  local_30 = (TypeField *)std::vector<TypeField,_std::allocator<TypeField>_>::begin(iter._M_current)
  ;
  cStack_20 = (const_iterator)local_30;
  while( true ) {
    local_38._M_current =
         (TypeField *)std::vector<TypeField,_std::allocator<TypeField>_>::end(iter._M_current);
    bVar2 = __gnu_cxx::operator!=(&stack0xffffffffffffffe0,&local_38);
    if (!bVar2) break;
    pTVar4 = __gnu_cxx::
             __normal_iterator<const_TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_>
             ::operator*(&stack0xffffffffffffffe0);
    std::vector<TypeField,_std::allocator<TypeField>_>::push_back(&this->field,pTVar4);
    pTVar4 = __gnu_cxx::
             __normal_iterator<const_TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_>
             ::operator*(&stack0xffffffffffffffe0);
    iVar1 = pTVar4->offset;
    pTVar4 = __gnu_cxx::
             __normal_iterator<const_TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_>
             ::operator*(&stack0xffffffffffffffe0);
    iVar3 = Datatype::getSize(pTVar4->type);
    local_24 = iVar1 + iVar3;
    if ((this->super_Datatype).size < local_24) {
      (this->super_Datatype).size = local_24;
    }
    __gnu_cxx::
    __normal_iterator<const_TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_>::
    operator++(&stack0xffffffffffffffe0);
  }
  return;
}

Assistant:

void TypeStruct::setFields(const vector<TypeField> &fd)

{
  vector<TypeField>::const_iterator iter;
  int4 end;
				// Need to calculate size
  size = 0;
  for(iter=fd.begin();iter!=fd.end();++iter) {
    field.push_back(*iter);
    end = (*iter).offset + (*iter).type->getSize();
    if (end > size)
      size = end;
  }
}